

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osqp.c
# Opt level: O1

c_int osqp_solve(OSQPWorkspace *work)

{
  ulong compute_objective;
  OSQPSettings *pOVar1;
  OSQPInfo *pOVar2;
  bool bVar3;
  int iVar4;
  c_int cVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  bool bVar10;
  c_float cVar11;
  double dVar12;
  double dVar13;
  
  if (work == (OSQPWorkspace *)0x0) {
    cVar5 = _osqp_error(OSQP_WORKSPACE_NOT_INIT_ERROR,"osqp_solve");
    return cVar5;
  }
  if (work->clear_update_time == 1) {
    work->info->update_time = 0.0;
  }
  work->rho_update_from_solve = 1;
  compute_objective = work->settings->verbose;
  osqp_tic(work->timer);
  if (work->settings->verbose != 0) {
    print_header();
  }
  osqp_start_interrupt_listener();
  if (work->settings->warm_start == 0) {
    cold_start(work);
  }
  if (work->settings->max_iter < 1) {
    lVar9 = 1;
    bVar3 = false;
    uVar7 = compute_objective;
  }
  else {
    uVar7 = 1;
    bVar3 = false;
    lVar9 = 0;
    do {
      lVar8 = lVar9;
      swap_vectors(&work->x,&work->x_prev);
      swap_vectors(&work->z,&work->z_prev);
      update_xz_tilde(work);
      update_x(work);
      update_z(work);
      update_y(work);
      iVar4 = osqp_is_interrupted();
      if (iVar4 != 0) {
        update_status(work->info,-5);
        puts("Solver interrupted");
LAB_00107966:
        cVar5 = 1;
        goto LAB_00107b77;
      }
      lVar9 = lVar8 + 1;
      dVar12 = *(double *)(work->info->status + (ulong)(work->first_run == 0) * 0x10 + 0x48);
      cVar11 = osqp_toc(work->timer);
      pOVar1 = work->settings;
      dVar13 = pOVar1->time_limit;
      if (((dVar13 != 0.0) || (NAN(dVar13))) && (dVar13 <= dVar12 + cVar11)) {
        update_status(work->info,-6);
        if (work->settings->verbose != 0) {
          puts("run time limit reached");
        }
        uVar7 = 0;
        goto LAB_001079a6;
      }
      bVar3 = pOVar1->check_termination != 0 && lVar9 % pOVar1->check_termination == 0;
      if (pOVar1->verbose == 0) {
        bVar10 = false;
      }
      else {
        bVar10 = lVar8 == 0 || (uVar7 / 200) * 200 + -1 == lVar8;
      }
      if ((bVar3 | bVar10) == 1) {
        update_info(work,lVar9,compute_objective,0);
        if (bVar10 != false) {
          print_summary(work);
        }
        if ((bVar3) && (cVar5 = check_termination(work,0), cVar5 != 0)) {
          uVar7 = (ulong)bVar10;
          goto LAB_001079a6;
        }
      }
      if ((work->settings->adaptive_rho != 0) && (work->settings->adaptive_rho_interval == 0)) {
        cVar11 = osqp_toc(work->timer);
        if (work->settings->adaptive_rho_fraction * work->info->setup_time < cVar11) {
          lVar6 = work->settings->check_termination;
          if (lVar6 == 0) {
            dVar12 = (double)lVar9 + 12.5;
            dVar13 = 25.0;
          }
          else {
            dVar13 = (double)lVar6;
            dVar12 = dVar13 * 0.5 + (double)lVar9;
          }
          dVar13 = fmod(dVar12,dVar13);
          lVar6 = work->settings->check_termination;
          if (lVar6 < (long)(dVar12 - dVar13)) {
            lVar6 = (long)(dVar12 - dVar13);
          }
          work->settings->adaptive_rho_interval = lVar6;
        }
      }
      if (((work->settings->adaptive_rho != 0) &&
          (lVar6 = work->settings->adaptive_rho_interval, lVar6 != 0)) && (lVar9 % lVar6 == 0)) {
        if ((bVar3 | bVar10) == 0) {
          update_info(work,lVar9,compute_objective,0);
        }
        cVar5 = adapt_rho(work);
        if (cVar5 != 0) {
          printf("ERROR in %s: ","osqp_solve");
          printf("Failed rho update");
          putchar(10);
          goto LAB_00107966;
        }
      }
      uVar7 = uVar7 + 1;
      lVar9 = lVar8 + 1;
    } while (lVar8 + 1 < work->settings->max_iter);
    uVar7 = (ulong)bVar10;
    lVar9 = lVar8 + 2;
  }
LAB_001079a6:
  if (!bVar3) {
    if (uVar7 == 0) {
      update_info(work,lVar9 + -1,compute_objective,0);
    }
    if ((work->settings->verbose != 0) && (work->summary_printed == 0)) {
      print_summary(work);
    }
    check_termination(work,0);
  }
  if ((compute_objective == 0) && (cVar5 = has_solution(work->info), cVar5 != 0)) {
    cVar11 = compute_obj_val(work,work->x);
    work->info->obj_val = cVar11;
  }
  if ((work->settings->verbose != 0) && (work->summary_printed == 0)) {
    print_summary(work);
  }
  if ((work->info->status_val == -10) && (cVar5 = check_termination(work,1), cVar5 == 0)) {
    update_status(work->info,-2);
  }
  if ((work->info->status_val == -6) && (cVar5 = check_termination(work,1), cVar5 == 0)) {
    update_status(work->info,-6);
  }
  cVar11 = compute_rho_estimate(work);
  work->info->rho_estimate = cVar11;
  cVar11 = osqp_toc(work->timer);
  pOVar2 = work->info;
  pOVar2->solve_time = cVar11;
  if ((work->settings->polish != 0) && (pOVar2->status_val == 1)) {
    polish(work);
  }
  lVar9 = work->first_run;
  pOVar2 = work->info;
  pOVar2->run_time =
       *(double *)(pOVar2->status + (ulong)(lVar9 == 0) * 0x10 + 0x48) + pOVar2->solve_time +
       pOVar2->polish_time;
  if (lVar9 != 0) {
    work->first_run = 0;
  }
  work->clear_update_time = 1;
  work->rho_update_from_solve = 0;
  if (work->settings->verbose != 0) {
    print_footer(work->info,work->settings->polish);
  }
  store_solution(work);
  cVar5 = 0;
LAB_00107b77:
  osqp_end_interrupt_listener();
  return cVar5;
}

Assistant:

c_int osqp_solve(OSQPWorkspace *work) {

  c_int exitflag;
  c_int iter;
  c_int compute_cost_function; // Boolean: compute the cost function in the loop or not
  c_int can_check_termination; // Boolean: check termination or not

#ifdef PROFILING
  c_float temp_run_time;       // Temporary variable to store current run time
#endif /* ifdef PROFILING */

#ifdef PRINTING
  c_int can_print;             // Boolean whether you can print
#endif /* ifdef PRINTING */

  // Check if workspace has been initialized
  if (!work) return osqp_error(OSQP_WORKSPACE_NOT_INIT_ERROR);

#ifdef PROFILING
  if (work->clear_update_time == 1)
    work->info->update_time = 0.0;
  work->rho_update_from_solve = 1;
#endif /* ifdef PROFILING */

  // Initialize variables
  exitflag              = 0;
  can_check_termination = 0;
#ifdef PRINTING
  can_print = work->settings->verbose;
#endif /* ifdef PRINTING */
#ifdef PRINTING
  compute_cost_function = work->settings->verbose; // Compute cost function only
                                                   // if verbose is on
#else /* ifdef PRINTING */
  compute_cost_function = 0;                       // Never compute cost
                                                   // function during the
                                                   // iterations if no printing
                                                   // enabled
#endif /* ifdef PRINTING */



#ifdef PROFILING
  osqp_tic(work->timer); // Start timer
#endif /* ifdef PROFILING */


#ifdef PRINTING

  if (work->settings->verbose) {
    // Print Header for every column
    print_header();
  }
#endif /* ifdef PRINTING */

#ifdef CTRLC

  // initialize Ctrl-C support
  osqp_start_interrupt_listener();
#endif /* ifdef CTRLC */

  // Initialize variables (cold start or warm start depending on settings)
  if (!work->settings->warm_start) cold_start(work);  // If not warm start ->
                                                      // set x, z, y to zero

  // Main ADMM algorithm
  for (iter = 1; iter <= work->settings->max_iter; iter++) {
    // Update x_prev, z_prev (preallocated, no malloc)
    swap_vectors(&(work->x), &(work->x_prev));
    swap_vectors(&(work->z), &(work->z_prev));

    /* ADMM STEPS */
    /* Compute \tilde{x}^{k+1}, \tilde{z}^{k+1} */
    update_xz_tilde(work);

    /* Compute x^{k+1} */
    update_x(work);

    /* Compute z^{k+1} */
    update_z(work);

    /* Compute y^{k+1} */
    update_y(work);

    /* End of ADMM Steps */

#ifdef CTRLC

    // Check the interrupt signal
    if (osqp_is_interrupted()) {
      update_status(work->info, OSQP_SIGINT);
# ifdef PRINTING
      c_print("Solver interrupted\n");
# endif /* ifdef PRINTING */
      exitflag = 1;
      goto exit;
    }
#endif /* ifdef CTRLC */

#ifdef PROFILING

    // Check if solver time_limit is enabled. In case, check if the current
    // run time is more than the time_limit option.
    if (work->first_run) {
      temp_run_time = work->info->setup_time + osqp_toc(work->timer);
    }
    else {
      temp_run_time = work->info->update_time + osqp_toc(work->timer);
    }

    if (work->settings->time_limit &&
        (temp_run_time >= work->settings->time_limit)) {
      update_status(work->info, OSQP_TIME_LIMIT_REACHED);
# ifdef PRINTING
      if (work->settings->verbose) c_print("run time limit reached\n");
      can_print = 0;  // Not printing at this iteration
# endif /* ifdef PRINTING */
      break;
    }
#endif /* ifdef PROFILING */


    // Can we check for termination ?
    can_check_termination = work->settings->check_termination &&
                            (iter % work->settings->check_termination == 0);

#ifdef PRINTING

    // Can we print ?
    can_print = work->settings->verbose &&
                ((iter % PRINT_INTERVAL == 0) || (iter == 1));

    if (can_check_termination || can_print) { // Update status in either of
                                              // these cases
      // Update information
      update_info(work, iter, compute_cost_function, 0);

      if (can_print) {
        // Print summary
        print_summary(work);
      }

      if (can_check_termination) {
        // Check algorithm termination
        if (check_termination(work, 0)) {
          // Terminate algorithm
          break;
        }
      }
    }
#else /* ifdef PRINTING */

    if (can_check_termination) {
      // Update information and compute also objective value
      update_info(work, iter, compute_cost_function, 0);

      // Check algorithm termination
      if (check_termination(work, 0)) {
        // Terminate algorithm
        break;
      }
    }
#endif /* ifdef PRINTING */


#if EMBEDDED != 1
# ifdef PROFILING

    // If adaptive rho with automatic interval, check if the solve time is a
    // certain fraction
    // of the setup time.
    if (work->settings->adaptive_rho && !work->settings->adaptive_rho_interval) {
      // Check time
      if (osqp_toc(work->timer) >
          work->settings->adaptive_rho_fraction * work->info->setup_time) {
        // Enough time has passed. We now get the number of iterations between
        // the updates.
        if (work->settings->check_termination) {
          // If check_termination is enabled, we round the number of iterations
          // between
          // rho updates to the closest multiple of check_termination
          work->settings->adaptive_rho_interval = (c_int)c_roundmultiple(iter,
                                                                         work->settings->check_termination);
        } else {
          // If check_termination is disabled, we round the number of iterations
          // between
          // updates to the closest multiple of the default check_termination
          // interval.
          work->settings->adaptive_rho_interval = (c_int)c_roundmultiple(iter,
                                                                         CHECK_TERMINATION);
        }

        // Make sure the interval is not 0 and at least check_termination times
        work->settings->adaptive_rho_interval = c_max(
          work->settings->adaptive_rho_interval,
          work->settings->check_termination);
      } // If time condition is met
    }   // If adaptive rho enabled and interval set to auto
# endif // PROFILING

    // Adapt rho
    if (work->settings->adaptive_rho &&
        work->settings->adaptive_rho_interval &&
        (iter % work->settings->adaptive_rho_interval == 0)) {
      // Update info with the residuals if it hasn't been done before
# ifdef PRINTING

      if (!can_check_termination && !can_print) {
        // Information has not been computed neither for termination or printing
        // reasons
        update_info(work, iter, compute_cost_function, 0);
      }
# else /* ifdef PRINTING */

      if (!can_check_termination) {
        // Information has not been computed before for termination check
        update_info(work, iter, compute_cost_function, 0);
      }
# endif /* ifdef PRINTING */

      // Actually update rho
      if (adapt_rho(work)) {
# ifdef PRINTING
        c_eprint("Failed rho update");
# endif // PRINTING
        exitflag = 1;
        goto exit;
      }
    }
#endif // EMBEDDED != 1

  }        // End of ADMM for loop


  // Update information and check termination condition if it hasn't been done
  // during last iteration (max_iter reached or check_termination disabled)
  if (!can_check_termination) {
    /* Update information */
#ifdef PRINTING

    if (!can_print) {
      // Update info only if it hasn't been updated before for printing
      // reasons
      update_info(work, iter - 1, compute_cost_function, 0);
    }
#else /* ifdef PRINTING */

    // If no printing is enabled, update info directly
    update_info(work, iter - 1, compute_cost_function, 0);
#endif /* ifdef PRINTING */

#ifdef PRINTING

    /* Print summary */
    if (work->settings->verbose && !work->summary_printed) print_summary(work);
#endif /* ifdef PRINTING */

    /* Check whether a termination criterion is triggered */
    check_termination(work, 0);
  }

  // Compute objective value in case it was not
  // computed during the iterations
  if (!compute_cost_function && has_solution(work->info)){
    work->info->obj_val = compute_obj_val(work, work->x);
  }


#ifdef PRINTING
  /* Print summary for last iteration */
  if (work->settings->verbose && !work->summary_printed) {
    print_summary(work);
  }
#endif /* ifdef PRINTING */

  /* if max iterations reached, change status accordingly */
  if (work->info->status_val == OSQP_UNSOLVED) {
    if (!check_termination(work, 1)) { // Try to check for approximate
      update_status(work->info, OSQP_MAX_ITER_REACHED);
    }
  }

#ifdef PROFILING
  /* if time-limit reached check termination and update status accordingly */
 if (work->info->status_val == OSQP_TIME_LIMIT_REACHED) {
    if (!check_termination(work, 1)) { // Try for approximate solutions
      update_status(work->info, OSQP_TIME_LIMIT_REACHED); /* Change update status back to OSQP_TIME_LIMIT_REACHED */
    }
  }
#endif /* ifdef PROFILING */


#if EMBEDDED != 1
  /* Update rho estimate */
  work->info->rho_estimate = compute_rho_estimate(work);
#endif /* if EMBEDDED != 1 */

  /* Update solve time */
#ifdef PROFILING
  work->info->solve_time = osqp_toc(work->timer);
#endif /* ifdef PROFILING */


#ifndef EMBEDDED
  // Polish the obtained solution
  if (work->settings->polish && (work->info->status_val == OSQP_SOLVED))
    polish(work);
#endif /* ifndef EMBEDDED */

#ifdef PROFILING
  /* Update total time */
  if (work->first_run) {
    // total time: setup + solve + polish
    work->info->run_time = work->info->setup_time +
                           work->info->solve_time +
                           work->info->polish_time;
  } else {
    // total time: update + solve + polish
    work->info->run_time = work->info->update_time +
                           work->info->solve_time +
                           work->info->polish_time;
  }

  // Indicate that the solve function has already been executed
  if (work->first_run) work->first_run = 0;

  // Indicate that the update_time should be set to zero
  work->clear_update_time = 1;

  // Indicate that osqp_update_rho is not called from osqp_solve
  work->rho_update_from_solve = 0;
#endif /* ifdef PROFILING */

#ifdef PRINTING
  /* Print final footer */
  if (work->settings->verbose) print_footer(work->info, work->settings->polish);
#endif /* ifdef PRINTING */

  // Store solution
  store_solution(work);


// Define exit flag for quitting function
#if defined(PROFILING) || defined(CTRLC) || EMBEDDED != 1
exit:
#endif /* if defined(PROFILING) || defined(CTRLC) || EMBEDDED != 1 */

#ifdef CTRLC
  // Restore previous signal handler
  osqp_end_interrupt_listener();
#endif /* ifdef CTRLC */

  return exitflag;
}